

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIO.cpp
# Opt level: O2

void highsLogHeader(HighsLogOptions *log_options,bool log_githash)

{
  undefined7 in_register_00000031;
  string githash_text;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string githash_string;
  
  std::__cxx11::string::string((string *)&githash_string,"fd8665394",(allocator *)&githash_text);
  if ((int)CONCAT71(in_register_00000031,log_githash) == 0) {
    std::__cxx11::string::string((string *)&githash_text,"",(allocator *)&local_50);
  }
  else {
    std::operator+(&local_50," (git hash: ",&githash_string);
    std::operator+(&githash_text,&local_50,")");
    std::__cxx11::string::~string((string *)&local_50);
  }
  highsLogUser(log_options,kInfo,"Running HiGHS %d.%d.%d%s: %s\n",1,10,0,
               githash_text._M_dataplus._M_p,kHighsCopyrightStatement_abi_cxx11_._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&githash_text);
  std::__cxx11::string::~string((string *)&githash_string);
  return;
}

Assistant:

void highsLogHeader(const HighsLogOptions& log_options,
                    const bool log_githash) {
  const std::string githash_string(HIGHS_GITHASH);
  const std::string githash_text =
      log_githash ? " (git hash: " + githash_string + ")" : "";
  highsLogUser(log_options, HighsLogType::kInfo,
               "Running HiGHS %d.%d.%d%s: %s\n", (int)HIGHS_VERSION_MAJOR,
               (int)HIGHS_VERSION_MINOR, (int)HIGHS_VERSION_PATCH,
               githash_text.c_str(), kHighsCopyrightStatement.c_str());
}